

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset_intel_7_series.h
# Opt level: O0

void __thiscall security::pawn::Intel7SeriesChipset::~Intel7SeriesChipset(Intel7SeriesChipset *this)

{
  Intel7SeriesChipset *this_local;
  
  ~Intel7SeriesChipset(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

static constexpr bool SupportsDevice(const Chipset::HardwareId& id) {
    // Device ids were taken from the Intel 7 Series / C216 Series Chipset
    // Specification Update, May 2014, Revision 015 (document number
    // 326777-015).
    return id.vendor == 0x8086 &&
           (id.device == 0x1E47 /* Q77 */ || id.device == 0x1E48 /* Q75 */ ||
            id.device == 0x1E49 /* B75 */ || id.device == 0x1E44 /* Z77 */ ||
            id.device == 0x1E46 /* Z75 */ || id.device == 0x1E4A /* H77 */ ||
            id.device == 0x1E53 /* C216 */ || id.device == 0x1E55 /* QM77 */ ||
            id.device == 0x1E58 /* UM77 */ || id.device == 0x1E57 /* HM77 */ ||
            id.device == 0x1E59 /* HM76 */ || id.device == 0x1E5D /* HM75 */ ||
            id.device == 0x1E5E /* HM70 */ || id.device == 0x1E56 /* QS77 */ ||
            id.device == 0x1E5F /* NM70 */);
  }